

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxReduce_GlobalScan_Test::TestBody(MxxReduce_GlobalScan_Test *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  iterator begin;
  iterator end;
  char *pcVar4;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  size_t i_2;
  Message local_140;
  size_type local_138;
  size_type local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> result;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  size_t i_1;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> local_cpy;
  size_t i;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> local;
  int local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_38;
  int presize;
  size_t n;
  comm c;
  MxxReduce_GlobalScan_Test *this_local;
  
  c._24_8_ = this;
  mxx::comm::comm((comm *)&n);
  pbStack_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3c = 0;
  iVar2 = mxx::comm::rank((comm *)&n);
  if (iVar2 % 2 == 0) {
    iVar2 = mxx::comm::rank((comm *)&n);
    pbStack_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (long)(iVar2 / 2 + 1);
    local_3c = (int)((ulong)((long)pbStack_38 * (long)((long)&pbStack_38[-1].field_2 + 0xf)) >> 1);
  }
  std::allocator<int>::allocator((allocator<int> *)((long)&i + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(size_type)pbStack_38,
             (allocator<int> *)((long)&i + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&i + 7));
  for (local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < pbStack_38;
      local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    iVar2 = (int)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,
                        (size_type)
                        local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pvVar3 = local_3c + iVar2 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_90,
             (vector<int,_std::allocator<int>_> *)local_68);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_90);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_90);
  mxx::global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (comm *)&n);
  for (gtest_ar.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar.message_.ptr_ < pbStack_38;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar.message_.ptr_)->field_0x1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,
                        (size_type)gtest_ar.message_.ptr_);
    iVar2 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_68,
                        (size_type)gtest_ar.message_.ptr_);
    local_bc = (iVar2 * (*pvVar3 + 1)) / 2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_90,
                        (size_type)gtest_ar.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_b8,"local[i]*(local[i]+1)/2","local_cpy[i]",&local_bc,pvVar3
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x109,pcVar4);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._5_3_ = 0;
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ != 0) goto LAB_00118b45;
  }
  mxx::comm::comm((comm *)&gtest_ar_1.message_);
  mxx::global_scan<int,MxxReduce_GlobalScan_Test::TestBody()::__0>
            (local_f0,(mxx *)local_68,&gtest_ar_1.message_);
  mxx::comm::~comm((comm *)&gtest_ar_1.message_);
  local_130 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_68);
  local_138 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_128,"local.size()","result.size()",&local_130,&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0x10e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
    testing::Message::~Message(&local_140);
  }
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._5_3_ = 0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == 0) {
    for (gtest_ar_2.message_.ptr_ =
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar_2.message_.ptr_ < pbStack_38;
        gtest_ar_2.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(gtest_ar_2.message_.ptr_)->field_0x1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,
                          (size_type)gtest_ar_2.message_.ptr_);
      iVar2 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_68,
                          (size_type)gtest_ar_2.message_.ptr_);
      local_164 = (iVar2 * (*pvVar3 + 1)) / 2;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_f0,
                          (size_type)gtest_ar_2.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_160,"local[i]*(local[i]+1)/2","result[i]",&local_164,
                 pvVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x110,pcVar4);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message(&local_170);
      }
      result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._5_3_ = 0;
      result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != 0) goto LAB_00118b39;
    }
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
LAB_00118b39:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
LAB_00118b45:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  mxx::comm::~comm((comm *)&n);
  return;
}

Assistant:

TEST(MxxReduce, GlobalScan) {
    mxx::comm c;
    // test scan with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    // test inplace scan
    std::vector<int> local_cpy(local);
    mxx::global_scan_inplace(local_cpy.begin(), local_cpy.end(), c);
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, local_cpy[i]);
    }
    // test scan
    //std::vector<int> result(local.size());
    std::vector<int> result = mxx::global_scan(local, [](int x, int y) {return x+y;});
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, result[i]);
    }
}